

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint __thiscall
ON_SubDDisplayParameters::DisplayDensity(ON_SubDDisplayParameters *this,ON_SubD *subd)

{
  uint uVar1;
  ON_SubDFace *pOVar2;
  ON_SubDFaceIdIterator fit;
  ON_SubDFaceIdIterator local_40;
  
  uVar1 = (uint)this->m_display_density;
  if (this->m_bDisplayDensityIsAbsolute == false) {
    uVar1 = AbsoluteDisplayDensityFromSubD((uint)this->m_display_density,subd);
  }
  if (uVar1 == 0) {
    ON_SubDFaceIdIterator::ON_SubDFaceIdIterator(&local_40,subd);
    pOVar2 = ON_SubDFaceIdIterator::FirstFace(&local_40);
    while (pOVar2 != (ON_SubDFace *)0x0) {
      if (0x13 < (ushort)(pOVar2->m_edge_count + 0xf)) {
        ON_SubDRef::~ON_SubDRef(&local_40.m_subd_ref);
        return 1;
      }
      pOVar2 = ON_SubDFaceIdIterator::NextFace(&local_40);
    }
    ON_SubDRef::~ON_SubDRef(&local_40.m_subd_ref);
  }
  return uVar1;
}

Assistant:

unsigned int ON_SubDDisplayParameters::DisplayDensity(const ON_SubD& subd) const
{
  const unsigned display_density = this->m_display_density;
  const unsigned absolute_display_density
    = this->DisplayDensityIsAdaptive() 
    ? ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubD(display_density, subd)
    : display_density
    ;

  if (0 == absolute_display_density)
  {
    // If subd has ngons with n != 4, then the display density has to be >= 1.
    ON_SubDFaceIdIterator fit(subd);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (4 != f->m_edge_count && f->m_edge_count > 3 && f->m_edge_count <= ON_SubDFace::MaximumEdgeCount)
      {
        // This face will have f->m_edge_count subd mesh fragments of density 0.
        // That's why the default quad face density must be >= 1.
        return 1u;
      }
    }
  }

  return absolute_display_density;
}